

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# n2builder.cpp
# Opt level: O3

LocalUCPTriePointer __thiscall
icu_63::Normalizer2DataBuilder::processData(Normalizer2DataBuilder *this)

{
  UnicodeString *this_00;
  UErrorCode *pErrorCode;
  short sVar1;
  undefined4 srcLength;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  FILE *__stream;
  Normalizer2DataBuilder *pNVar5;
  uint uVar6;
  UChar32 UVar7;
  int32_t iVar8;
  int iVar9;
  UErrorCode __status;
  UMutableCPTrie *pUVar10;
  UCPTrie *trie;
  uint8_t *data;
  char *pcVar11;
  undefined8 extraout_RAX;
  uint uVar12;
  int iVar13;
  Normalizer2DataBuilder *in_RSI;
  uint uVar14;
  uint value_00;
  long lVar15;
  int iVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  uint32_t value;
  LocalUCPTriePointer *builtTrie;
  IcuToolErrorCode errorCode;
  Norm16Writer norm16Writer;
  CompositionBuilder compBuilder;
  ExtraData extra;
  uint local_42c;
  Normalizer2DataBuilder *local_428;
  LocalPointerBase<UCPTrie> local_420;
  UMutableCPTrie *local_418;
  IcuToolErrorCode local_410;
  uint local_3f4;
  Enumerator local_3f0;
  char local_3e0;
  Enumerator local_3d8;
  UMutableCPTrie *local_3c0;
  Enumerator local_3b8;
  ExtraData local_3a8;
  
  local_3b8._vptr_Enumerator = (_func_int **)&PTR__Enumerator_003abf28;
  local_420.ptr = (UCPTrie *)this;
  Norms::enumRanges(&in_RSI->norms,&local_3b8);
  local_3f0._vptr_Enumerator = (_func_int **)&PTR__Enumerator_003abf68;
  do {
    local_3e0 = '\0';
    Norms::enumRanges(&in_RSI->norms,&local_3f0);
  } while (local_3e0 != '\0');
  uVar6 = utm_countItems((in_RSI->norms).normMem);
  if (1 < (int)uVar6) {
    lVar15 = 0x40;
    do {
      postProcess(in_RSI,(Norm *)((long)&((in_RSI->norms).norms)->mapping + lVar15));
      lVar15 = lVar15 + 0x40;
    } while ((ulong)uVar6 << 6 != lVar15);
  }
  ExtraData::ExtraData(&local_3a8,&in_RSI->norms,in_RSI->optimization == OPTIMIZE_FAST);
  Norms::enumRanges(&in_RSI->norms,&local_3a8.super_Enumerator);
  this_00 = &in_RSI->extraData;
  UnicodeString::operator=(this_00,&local_3a8.yesYesCompositions);
  sVar1 = (in_RSI->extraData).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar13 = (in_RSI->extraData).fUnion.fFields.fLength;
  }
  else {
    iVar13 = (int)sVar1 >> 5;
  }
  in_RSI->indexes[10] = iVar13 * 2;
  if (-1 < local_3a8.yesNoMappingsAndCompositions.fUnion.fStackFields.fLengthAndFlags) {
    local_3a8.yesNoMappingsAndCompositions.fUnion.fFields.fLength =
         (int)local_3a8.yesNoMappingsAndCompositions.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  UnicodeString::doAppend
            (this_00,&local_3a8.yesNoMappingsAndCompositions,0,
             local_3a8.yesNoMappingsAndCompositions.fUnion.fFields.fLength);
  sVar1 = (in_RSI->extraData).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar13 = (in_RSI->extraData).fUnion.fFields.fLength;
  }
  else {
    iVar13 = (int)sVar1 >> 5;
  }
  in_RSI->indexes[0xe] = iVar13 * 2;
  if (-1 < local_3a8.yesNoMappingsOnly.fUnion.fStackFields.fLengthAndFlags) {
    local_3a8.yesNoMappingsOnly.fUnion.fFields.fLength =
         (int)local_3a8.yesNoMappingsOnly.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  UnicodeString::doAppend
            (this_00,&local_3a8.yesNoMappingsOnly,0,
             local_3a8.yesNoMappingsOnly.fUnion.fFields.fLength);
  sVar1 = (in_RSI->extraData).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar13 = (in_RSI->extraData).fUnion.fFields.fLength;
  }
  else {
    iVar13 = (int)sVar1 >> 5;
  }
  in_RSI->indexes[0xb] = iVar13 * 2;
  if (-1 < local_3a8.noNoMappingsCompYes.fUnion.fStackFields.fLengthAndFlags) {
    local_3a8.noNoMappingsCompYes.fUnion.fFields.fLength =
         (int)local_3a8.noNoMappingsCompYes.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  UnicodeString::doAppend
            (this_00,&local_3a8.noNoMappingsCompYes,0,
             local_3a8.noNoMappingsCompYes.fUnion.fFields.fLength);
  sVar1 = (in_RSI->extraData).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar13 = (in_RSI->extraData).fUnion.fFields.fLength;
  }
  else {
    iVar13 = (int)sVar1 >> 5;
  }
  in_RSI->indexes[0xf] = iVar13 * 2;
  if (-1 < local_3a8.noNoMappingsCompBoundaryBefore.fUnion.fStackFields.fLengthAndFlags) {
    local_3a8.noNoMappingsCompBoundaryBefore.fUnion.fFields.fLength =
         (int)local_3a8.noNoMappingsCompBoundaryBefore.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  UnicodeString::doAppend
            (this_00,&local_3a8.noNoMappingsCompBoundaryBefore,0,
             local_3a8.noNoMappingsCompBoundaryBefore.fUnion.fFields.fLength);
  sVar1 = (in_RSI->extraData).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar13 = (in_RSI->extraData).fUnion.fFields.fLength;
  }
  else {
    iVar13 = (int)sVar1 >> 5;
  }
  in_RSI->indexes[0x10] = iVar13 * 2;
  if (-1 < local_3a8.noNoMappingsCompNoMaybeCC.fUnion.fStackFields.fLengthAndFlags) {
    local_3a8.noNoMappingsCompNoMaybeCC.fUnion.fFields.fLength =
         (int)local_3a8.noNoMappingsCompNoMaybeCC.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  UnicodeString::doAppend
            (this_00,&local_3a8.noNoMappingsCompNoMaybeCC,0,
             local_3a8.noNoMappingsCompNoMaybeCC.fUnion.fFields.fLength);
  sVar1 = (in_RSI->extraData).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar13 = (in_RSI->extraData).fUnion.fFields.fLength;
  }
  else {
    iVar13 = (int)sVar1 >> 5;
  }
  in_RSI->indexes[0x11] = iVar13 * 2;
  if (-1 < local_3a8.noNoMappingsEmpty.fUnion.fStackFields.fLengthAndFlags) {
    local_3a8.noNoMappingsEmpty.fUnion.fFields.fLength =
         (int)local_3a8.noNoMappingsEmpty.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  UnicodeString::doAppend
            (this_00,&local_3a8.noNoMappingsEmpty,0,
             local_3a8.noNoMappingsEmpty.fUnion.fFields.fLength);
  sVar1 = (in_RSI->extraData).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar13 = (in_RSI->extraData).fUnion.fFields.fLength;
  }
  else {
    iVar13 = (int)sVar1 >> 5;
  }
  in_RSI->indexes[0xc] = iVar13 * 2;
  srcLength = local_3a8.maybeYesCompositions.fUnion.fFields.fLength;
  if (-1 < local_3a8.maybeYesCompositions.fUnion.fStackFields.fLengthAndFlags) {
    srcLength = (int)local_3a8.maybeYesCompositions.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  if ((srcLength & 3) != 0) {
    do {
      local_3d8._vptr_Enumerator =
           (_func_int **)((ulong)local_3d8._vptr_Enumerator & 0xffffffffffff0000);
      UnicodeString::doAppend(&local_3a8.maybeYesCompositions,(UChar *)&local_3d8,0,1);
      srcLength = local_3a8.maybeYesCompositions.fUnion.fFields.fLength;
      if (-1 < local_3a8.maybeYesCompositions.fUnion.fStackFields.fLengthAndFlags) {
        srcLength = (int)local_3a8.maybeYesCompositions.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
    } while ((srcLength & 3) != 0);
  }
  UnicodeString::doReplace(this_00,0,0,&local_3a8.maybeYesCompositions,0,srcLength);
  if (-1 < local_3a8.maybeYesCompositions.fUnion.fStackFields.fLengthAndFlags) {
    local_3a8.maybeYesCompositions.fUnion.fFields.fLength =
         (int)local_3a8.maybeYesCompositions.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  iVar13 = local_3a8.maybeYesCompositions.fUnion.fFields.fLength * -2 + 0xfc00;
  in_RSI->indexes[0xd] = iVar13;
  uVar6 = *(uint *)&(in_RSI->extraData).fUnion;
  if ((short)uVar6 < 0) {
    uVar6 = (in_RSI->extraData).fUnion.fFields.fLength;
  }
  else {
    uVar6 = uVar6 >> 5;
  }
  if ((uVar6 & 1) != 0) {
    local_3d8._vptr_Enumerator =
         (_func_int **)((ulong)local_3d8._vptr_Enumerator & 0xffffffffffff0000);
    UnicodeString::doAppend(this_00,(UChar *)&local_3d8,0,1);
    iVar13 = in_RSI->indexes[0xd];
  }
  uVar6 = iVar13 - 0x408;
  if ((int)uVar6 < in_RSI->indexes[0xc]) {
    processData();
  }
  else {
    in_RSI->indexes[8] = 0x110000;
    in_RSI->indexes[9] = 0x110000;
    in_RSI->indexes[0x12] = 0x110000;
    local_410.super_ErrorCode.errorCode = U_ZERO_ERROR;
    local_410.super_ErrorCode._vptr_ErrorCode = (_func_int **)&PTR__IcuToolErrorCode_003abfa8;
    local_410.location = "gennorm2/processData()";
    pUVar10 = umutablecptrie_open_63(1,1,&local_410.super_ErrorCode.errorCode);
    ErrorCode::assertSuccess(&local_410.super_ErrorCode);
    local_3d8._vptr_Enumerator = (_func_int **)&PTR__Enumerator_003abe70;
    local_3c0 = pUVar10;
    Norms::enumRanges(&in_RSI->norms,&local_3d8);
    setHangulData(in_RSI,pUVar10);
    UVar7 = umutablecptrie_getRange_63
                      (pUVar10,0xd800,UCPMAP_RANGE_NORMAL,0,(UCPMapValueFilter *)0x0,(void *)0x0,
                       &local_42c);
    local_418 = pUVar10;
    local_3f4 = uVar6;
    if ((local_42c == 1) && (0xdffe < UVar7)) {
      uVar6 = 0x10000;
      UVar7 = 0;
      value_00 = 0;
      uVar14 = 0;
      local_428 = in_RSI;
      while ((pNVar5 = local_428, (int)uVar6 <= UVar7 ||
             (UVar7 = umutablecptrie_getRange_63
                                (local_418,uVar6,UCPMAP_RANGE_NORMAL,0,(UCPMapValueFilter *)0x0,
                                 (void *)0x0,&local_42c), pUVar10 = local_418, -1 < UVar7))) {
        if (value_00 < local_42c) {
          value_00 = local_42c;
        }
        if ((uVar6 & 0x3ff) == 0) {
          value_00 = local_42c;
        }
        uVar14 = (uVar14 | -(uint)((uVar6 & 0x3ff) == 0)) & local_42c;
        if (UVar7 < (int)(uVar6 | 0x3ff)) {
          uVar6 = UVar7 + 1;
        }
        else {
          uVar12 = local_428->indexes[0xc];
          if (value_00 < (uint)local_428->indexes[0xc]) {
            uVar12 = value_00;
          }
          value_00 = uVar14 & 1 | uVar12 & 0xfffffffe;
          if (value_00 != 1) {
            umutablecptrie_set_63
                      (local_418,(uVar6 >> 10) + 0xd7c0 & 0xffff,value_00,
                       &local_410.super_ErrorCode.errorCode);
          }
          if (local_42c == 1) {
            uVar6 = UVar7 + 1U & 0xfffffc00;
          }
          else {
            uVar6 = (uVar6 | 0x3ff) + 1;
          }
        }
      }
      if (0xffff < pNVar5->indexes[8]) {
        pNVar5->indexes[8] = ((uint)pNVar5->indexes[8] >> 10) + 0xd7c0 & 0xffff;
      }
      if (0xffff < pNVar5->indexes[9]) {
        pNVar5->indexes[9] = ((uint)pNVar5->indexes[9] >> 10) + 0xd7c0 & 0xffff;
      }
      if (0xffff < pNVar5->indexes[0x12]) {
        pNVar5->indexes[0x12] = ((uint)pNVar5->indexes[0x12] >> 10) + 0xd7c0 & 0xffff;
      }
      pErrorCode = &local_410.super_ErrorCode.errorCode;
      trie = umutablecptrie_buildImmutable_63
                       (local_418,UCPTRIE_TYPE_FAST,UCPTRIE_VALUE_BITS_16,pErrorCode);
      (((Norms *)&(local_420.ptr)->index)->ccSet).super_UnicodeFilter.super_UnicodeFunctor.
      super_UObject._vptr_UObject = (_func_int **)trie;
      iVar8 = ucptrie_toBinary_63(trie,(void *)0x0,0,pErrorCode);
      local_428->norm16TrieLength = iVar8;
      __stream = _stderr;
      if (local_410.super_ErrorCode.errorCode == U_BUFFER_OVERFLOW_ERROR) {
        umutablecptrie_close_63(pUVar10);
        ErrorCode::reset(&local_410.super_ErrorCode);
        iVar8 = local_428->norm16TrieLength;
        iVar13 = -1;
        if (-1 < iVar8) {
          iVar13 = iVar8;
        }
        data = (uint8_t *)operator_new__((long)iVar13);
        local_428->norm16TrieBytes = data;
        ucptrie_toBinary_63(trie,data,iVar8,&local_410.super_ErrorCode.errorCode);
        ErrorCode::assertSuccess(&local_410.super_ErrorCode);
        local_428->indexes[0] = 0x50;
        iVar13 = local_428->norm16TrieLength;
        local_428->indexes[1] = iVar13 + 0x50;
        sVar1 = (local_428->extraData).fUnion.fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          iVar9 = (local_428->extraData).fUnion.fFields.fLength;
        }
        else {
          iVar9 = (int)sVar1 >> 5;
        }
        local_428->indexes[2] = iVar13 + iVar9 * 2 + 0x50;
        auVar4 = _DAT_002f48a0;
        auVar3 = _DAT_002f4890;
        auVar2 = _DAT_002f4880;
        iVar13 = iVar13 + iVar9 * 2 + 0x150;
        lVar15 = 0;
        iVar9 = (int)DAT_002f48b0;
        iVar16 = DAT_002f48b0._4_4_;
        do {
          auVar17._8_4_ = (int)lVar15;
          auVar17._0_8_ = lVar15;
          auVar17._12_4_ = (int)((ulong)lVar15 >> 0x20);
          auVar18 = (auVar17 | auVar3) ^ auVar4;
          if (auVar18._4_4_ == iVar16 && auVar18._0_4_ < iVar9) {
            local_428->indexes[lVar15 + 3] = iVar13;
            local_428->indexes[lVar15 + 4] = iVar13;
          }
          auVar17 = (auVar17 | auVar2) ^ auVar4;
          if (auVar17._4_4_ == iVar16 && auVar17._0_4_ < iVar9) {
            local_428->indexes[lVar15 + 5] = iVar13;
            local_428->indexes[lVar15 + 6] = iVar13;
          }
          lVar15 = lVar15 + 4;
        } while (lVar15 != 8);
        if (beVerbose != '\0') {
          printf("size of normalization trie:         %5ld bytes\n",
                 (long)local_428->norm16TrieLength);
          sVar1 = (local_428->extraData).fUnion.fStackFields.fLengthAndFlags;
          if (sVar1 < 0) {
            iVar9 = (local_428->extraData).fUnion.fFields.fLength;
          }
          else {
            iVar9 = (int)sVar1 >> 5;
          }
          printf("size of 16-bit extra data:          %5ld uint16_t\n",(long)iVar9);
          printf("size of small-FCD data:             %5ld bytes\n",0x100);
          printf("size of binary data file contents:  %5ld bytes\n",(long)iVar13);
          printf("minDecompNoCodePoint:              U+%04lX\n",(long)local_428->indexes[8]);
          printf("minCompNoMaybeCodePoint:           U+%04lX\n",(long)local_428->indexes[9]);
          printf("minLcccCodePoint:                  U+%04lX\n",(long)local_428->indexes[0x12]);
          printf("minYesNo: (with compositions)      0x%04x\n",(ulong)(uint)local_428->indexes[10]);
          printf("minYesNoMappingsOnly:              0x%04x\n",(ulong)(uint)local_428->indexes[0xe])
          ;
          printf("minNoNo: (comp-normalized)         0x%04x\n",(ulong)(uint)local_428->indexes[0xb])
          ;
          printf("minNoNoCompBoundaryBefore:         0x%04x\n",(ulong)(uint)local_428->indexes[0xf])
          ;
          printf("minNoNoCompNoMaybeCC:              0x%04x\n",(ulong)(uint)local_428->indexes[0x10]
                );
          printf("minNoNoEmpty:                      0x%04x\n",(ulong)(uint)local_428->indexes[0x11]
                );
          printf("limitNoNo:                         0x%04x\n",(ulong)(uint)local_428->indexes[0xc])
          ;
          printf("minNoNoDelta:                      0x%04x\n",(ulong)local_3f4);
          printf("minMaybeYes:                       0x%04x\n",(ulong)(uint)local_428->indexes[0xd])
          ;
        }
        if (*(int *)local_428->unicodeVersion == 0) {
          u_versionFromString_63(local_428->unicodeVersion,"11.0");
        }
        ::dataInfo.dataVersion = *&local_428->unicodeVersion;
        Norms::Enumerator::~Enumerator(&local_3d8);
        IcuToolErrorCode::~IcuToolErrorCode(&local_410);
        ExtraData::~ExtraData(&local_3a8);
        Norms::Enumerator::~Enumerator(&local_3f0);
        Norms::Enumerator::~Enumerator(&local_3b8);
        return (LocalUCPTriePointer)(LocalPointerBase<UCPTrie>)local_420.ptr;
      }
      pcVar11 = ErrorCode::errorName(&local_410.super_ErrorCode);
      fprintf(__stream,"gennorm2 error: unable to build/serialize the normalization trie - %s\n",
              pcVar11);
      __status = ErrorCode::reset(&local_410.super_ErrorCode);
      exit(__status);
    }
  }
  processData();
  LocalUCPTriePointer::~LocalUCPTriePointer((LocalUCPTriePointer *)local_420.ptr);
  Norms::Enumerator::~Enumerator(&local_3d8);
  IcuToolErrorCode::~IcuToolErrorCode(&local_410);
  ExtraData::~ExtraData(&local_3a8);
  Norms::Enumerator::~Enumerator(&local_3f0);
  Norms::Enumerator::~Enumerator(&local_3b8);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

LocalUCPTriePointer Normalizer2DataBuilder::processData() {
    // Build composition lists before recursive decomposition,
    // so that we still have the raw, pair-wise mappings.
    CompositionBuilder compBuilder(norms);
    norms.enumRanges(compBuilder);

    // Recursively decompose all mappings.
    Decomposer decomposer(norms);
    do {
        decomposer.didDecompose=FALSE;
        norms.enumRanges(decomposer);
    } while(decomposer.didDecompose);

    // Set the Norm::Type and other properties.
    int32_t normsLength=norms.length();
    for(int32_t i=1; i<normsLength; ++i) {
        postProcess(norms.getNormRefByIndex(i));
    }

    // Write the properties, mappings and composition lists to
    // appropriate parts of the "extra data" array.
    ExtraData extra(norms, optimization==OPTIMIZE_FAST);
    norms.enumRanges(extra);

    extraData=extra.yesYesCompositions;
    indexes[Normalizer2Impl::IX_MIN_YES_NO]=extraData.length()*2;
    extraData.append(extra.yesNoMappingsAndCompositions);
    indexes[Normalizer2Impl::IX_MIN_YES_NO_MAPPINGS_ONLY]=extraData.length()*2;
    extraData.append(extra.yesNoMappingsOnly);
    indexes[Normalizer2Impl::IX_MIN_NO_NO]=extraData.length()*2;
    extraData.append(extra.noNoMappingsCompYes);
    indexes[Normalizer2Impl::IX_MIN_NO_NO_COMP_BOUNDARY_BEFORE]=extraData.length()*2;
    extraData.append(extra.noNoMappingsCompBoundaryBefore);
    indexes[Normalizer2Impl::IX_MIN_NO_NO_COMP_NO_MAYBE_CC]=extraData.length()*2;
    extraData.append(extra.noNoMappingsCompNoMaybeCC);
    indexes[Normalizer2Impl::IX_MIN_NO_NO_EMPTY]=extraData.length()*2;
    extraData.append(extra.noNoMappingsEmpty);
    indexes[Normalizer2Impl::IX_LIMIT_NO_NO]=extraData.length()*2;

    // Pad the maybeYesCompositions length to a multiple of 4,
    // so that NO_NO_DELTA bits 2..1 can be used without subtracting the center.
    while(extra.maybeYesCompositions.length()&3) {
        extra.maybeYesCompositions.append((UChar)0);
    }
    extraData.insert(0, extra.maybeYesCompositions);
    indexes[Normalizer2Impl::IX_MIN_MAYBE_YES]=
        Normalizer2Impl::MIN_NORMAL_MAYBE_YES-
        extra.maybeYesCompositions.length()*2;

    // Pad to even length for 4-byte alignment of following data.
    if(extraData.length()&1) {
        extraData.append((UChar)0);
    }

    int32_t minNoNoDelta=getMinNoNoDelta();
    U_ASSERT((minNoNoDelta&7)==0);
    if(indexes[Normalizer2Impl::IX_LIMIT_NO_NO]>minNoNoDelta) {
        fprintf(stderr,
                "gennorm2 error: "
                "data structure overflow, too much mapping composition data\n");
        exit(U_BUFFER_OVERFLOW_ERROR);
    }

    // writeNorm16() and setHangulData() reduce these as needed.
    indexes[Normalizer2Impl::IX_MIN_DECOMP_NO_CP]=0x110000;
    indexes[Normalizer2Impl::IX_MIN_COMP_NO_MAYBE_CP]=0x110000;
    indexes[Normalizer2Impl::IX_MIN_LCCC_CP]=0x110000;

    IcuToolErrorCode errorCode("gennorm2/processData()");
    UMutableCPTrie *norm16Trie = umutablecptrie_open(
        Normalizer2Impl::INERT, Normalizer2Impl::INERT, errorCode);
    errorCode.assertSuccess();

    // Map each code point to its norm16 value,
    // including the properties that fit directly,
    // and the offset to the "extra data" if necessary.
    Norm16Writer norm16Writer(norm16Trie, norms, *this);
    norms.enumRanges(norm16Writer);
    // TODO: iterate via getRange() instead of callback?

    setHangulData(norm16Trie);

    // Look for the "worst" norm16 value of any supplementary code point
    // corresponding to a lead surrogate, and set it as that surrogate's value.
    // Enables UTF-16 quick check inner loops to look at only code units.
    //
    // We could be more sophisticated:
    // We could collect a bit set for whether there are values in the different
    // norm16 ranges (yesNo, maybeYes, yesYesWithCC etc.)
    // and select the best value that only breaks the composition and/or decomposition
    // inner loops if necessary.
    // However, that seems like overkill for an optimization for supplementary characters.
    //
    // First check that surrogate code *points* are inert.
    // The parser should have rejected values/mappings for them.
    uint32_t value;
    UChar32 end = umutablecptrie_getRange(norm16Trie, 0xd800, UCPMAP_RANGE_NORMAL, 0,
                                          nullptr, nullptr, &value);
    if (value != Normalizer2Impl::INERT || end < 0xdfff) {
        fprintf(stderr,
                "gennorm2 error: not all surrogate code points are inert: U+d800..U+%04x=%lx\n",
                (int)end, (long)value);
        exit(U_INTERNAL_PROGRAM_ERROR);
    }
    uint32_t maxNorm16 = 0;
    // ANDing values yields 0 bits where any value has a 0.
    // Used for worst-case HAS_COMP_BOUNDARY_AFTER.
    uint32_t andedNorm16 = 0;
    end = 0;
    for (UChar32 start = 0x10000;;) {
        if (start > end) {
            end = umutablecptrie_getRange(norm16Trie, start, UCPMAP_RANGE_NORMAL, 0,
                                          nullptr, nullptr, &value);
            if (end < 0) { break; }
        }
        if ((start & 0x3ff) == 0) {
            // Data for a new lead surrogate.
            maxNorm16 = andedNorm16 = value;
        } else {
            if (value > maxNorm16) {
                maxNorm16 = value;
            }
            andedNorm16 &= value;
        }
        // Intersect each range with the code points for one lead surrogate.
        UChar32 leadEnd = start | 0x3ff;
        if (leadEnd <= end) {
            // End of the supplementary block for a lead surrogate.
            if (maxNorm16 >= (uint32_t)indexes[Normalizer2Impl::IX_LIMIT_NO_NO]) {
                // Set noNo ("worst" value) if it got into "less-bad" maybeYes or ccc!=0.
                // Otherwise it might end up at something like JAMO_VT which stays in
                // the inner decomposition quick check loop.
                maxNorm16 = (uint32_t)indexes[Normalizer2Impl::IX_LIMIT_NO_NO];
            }
            maxNorm16 =
                (maxNorm16 & ~Normalizer2Impl::HAS_COMP_BOUNDARY_AFTER)|
                (andedNorm16 & Normalizer2Impl::HAS_COMP_BOUNDARY_AFTER);
            if (maxNorm16 != Normalizer2Impl::INERT) {
                umutablecptrie_set(norm16Trie, U16_LEAD(start), maxNorm16, errorCode);
            }
            if (value == Normalizer2Impl::INERT) {
                // Potentially skip inert supplementary blocks for several lead surrogates.
                start = (end + 1) & ~0x3ff;
            } else {
                start = leadEnd + 1;
            }
        } else {
            start = end + 1;
        }
    }

    // Adjust supplementary minimum code points to break quick check loops at their lead surrogates.
    // For an empty data file, minCP=0x110000 turns into 0xdc00 (first trail surrogate)
    // which is harmless.
    // As a result, the minimum code points are always BMP code points.
    int32_t minCP=indexes[Normalizer2Impl::IX_MIN_DECOMP_NO_CP];
    if(minCP>=0x10000) {
        indexes[Normalizer2Impl::IX_MIN_DECOMP_NO_CP]=U16_LEAD(minCP);
    }
    minCP=indexes[Normalizer2Impl::IX_MIN_COMP_NO_MAYBE_CP];
    if(minCP>=0x10000) {
        indexes[Normalizer2Impl::IX_MIN_COMP_NO_MAYBE_CP]=U16_LEAD(minCP);
    }
    minCP=indexes[Normalizer2Impl::IX_MIN_LCCC_CP];
    if(minCP>=0x10000) {
        indexes[Normalizer2Impl::IX_MIN_LCCC_CP]=U16_LEAD(minCP);
    }

    LocalUCPTriePointer builtTrie(
        umutablecptrie_buildImmutable(norm16Trie, UCPTRIE_TYPE_FAST, UCPTRIE_VALUE_BITS_16, errorCode));
    norm16TrieLength=ucptrie_toBinary(builtTrie.getAlias(), nullptr, 0, errorCode);
    if(errorCode.get()!=U_BUFFER_OVERFLOW_ERROR) {
        fprintf(stderr, "gennorm2 error: unable to build/serialize the normalization trie - %s\n",
                errorCode.errorName());
        exit(errorCode.reset());
    }
    umutablecptrie_close(norm16Trie);
    errorCode.reset();
    norm16TrieBytes=new uint8_t[norm16TrieLength];
    ucptrie_toBinary(builtTrie.getAlias(), norm16TrieBytes, norm16TrieLength, errorCode);
    errorCode.assertSuccess();

    int32_t offset=(int32_t)sizeof(indexes);
    indexes[Normalizer2Impl::IX_NORM_TRIE_OFFSET]=offset;
    offset+=norm16TrieLength;
    indexes[Normalizer2Impl::IX_EXTRA_DATA_OFFSET]=offset;
    offset+=extraData.length()*2;
    indexes[Normalizer2Impl::IX_SMALL_FCD_OFFSET]=offset;
    offset+=sizeof(smallFCD);
    int32_t totalSize=offset;
    for(int32_t i=Normalizer2Impl::IX_RESERVED3_OFFSET; i<=Normalizer2Impl::IX_TOTAL_SIZE; ++i) {
        indexes[i]=totalSize;
    }

    if(beVerbose) {
        printf("size of normalization trie:         %5ld bytes\n", (long)norm16TrieLength);
        printf("size of 16-bit extra data:          %5ld uint16_t\n", (long)extraData.length());
        printf("size of small-FCD data:             %5ld bytes\n", (long)sizeof(smallFCD));
        printf("size of binary data file contents:  %5ld bytes\n", (long)totalSize);
        printf("minDecompNoCodePoint:              U+%04lX\n", (long)indexes[Normalizer2Impl::IX_MIN_DECOMP_NO_CP]);
        printf("minCompNoMaybeCodePoint:           U+%04lX\n", (long)indexes[Normalizer2Impl::IX_MIN_COMP_NO_MAYBE_CP]);
        printf("minLcccCodePoint:                  U+%04lX\n", (long)indexes[Normalizer2Impl::IX_MIN_LCCC_CP]);
        printf("minYesNo: (with compositions)      0x%04x\n", (int)indexes[Normalizer2Impl::IX_MIN_YES_NO]);
        printf("minYesNoMappingsOnly:              0x%04x\n", (int)indexes[Normalizer2Impl::IX_MIN_YES_NO_MAPPINGS_ONLY]);
        printf("minNoNo: (comp-normalized)         0x%04x\n", (int)indexes[Normalizer2Impl::IX_MIN_NO_NO]);
        printf("minNoNoCompBoundaryBefore:         0x%04x\n", (int)indexes[Normalizer2Impl::IX_MIN_NO_NO_COMP_BOUNDARY_BEFORE]);
        printf("minNoNoCompNoMaybeCC:              0x%04x\n", (int)indexes[Normalizer2Impl::IX_MIN_NO_NO_COMP_NO_MAYBE_CC]);
        printf("minNoNoEmpty:                      0x%04x\n", (int)indexes[Normalizer2Impl::IX_MIN_NO_NO_EMPTY]);
        printf("limitNoNo:                         0x%04x\n", (int)indexes[Normalizer2Impl::IX_LIMIT_NO_NO]);
        printf("minNoNoDelta:                      0x%04x\n", (int)minNoNoDelta);
        printf("minMaybeYes:                       0x%04x\n", (int)indexes[Normalizer2Impl::IX_MIN_MAYBE_YES]);
    }

    UVersionInfo nullVersion={ 0, 0, 0, 0 };
    if(0==memcmp(nullVersion, unicodeVersion, 4)) {
        u_versionFromString(unicodeVersion, U_UNICODE_VERSION);
    }
    memcpy(dataInfo.dataVersion, unicodeVersion, 4);
    return builtTrie;
}